

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

void __thiscall SAUF_BG<UFPC>::SecondScan(SAUF_BG<UFPC> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  puVar4 = UFPC::P_;
  uVar5 = 1;
  if (1 < UFPC::length_) {
    uVar5 = 1;
    uVar7 = 1;
    do {
      if (puVar4[uVar7] < uVar7) {
        uVar9 = puVar4[puVar4[uVar7]];
      }
      else {
        uVar9 = uVar5;
        uVar5 = uVar5 + 1;
      }
      puVar4[uVar7] = uVar9;
      uVar7 = uVar7 + 1;
    } while (uVar7 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_true>).n_labels_ = uVar5;
  puVar4 = UFPC::P_;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  iVar10 = *(int *)&pMVar2->field_0x8;
  if (0 < iVar10) {
    lVar6 = *(long *)&pMVar2->field_0x10;
    lVar3 = **(long **)&pMVar2->field_0x48;
    lVar8 = 0;
    do {
      iVar1 = *(int *)&pMVar2->field_0xc;
      if ((long)iVar1 != 0) {
        lVar11 = 0;
        do {
          *(uint *)(lVar6 + lVar11) = puVar4[*(uint *)(lVar6 + lVar11)];
          lVar11 = lVar11 + 4;
        } while ((long)iVar1 * 4 != lVar11);
        iVar10 = *(int *)&pMVar2->field_0x8;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + lVar3;
    } while (lVar8 < iVar10);
  }
  return;
}

Assistant:

static unsigned Flatten()
    {
        unsigned k = 1;
        for (unsigned i = 1; i < length_; ++i) {
            if (P_[i] < i) {
                P_[i] = P_[P_[i]];
            }
            else {
                P_[i] = k;
                k = k + 1;
            }
        }
        return k;
    }